

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APIntOps::RoundingUDiv(APIntOps *this,APInt *A,APInt *B,Rounding RM)

{
  bool bVar1;
  undefined8 extraout_RDX;
  APInt AVar3;
  APInt Quo;
  APInt Rem;
  APInt local_20;
  undefined8 uVar2;
  
  if (RM < UP) {
    AVar3 = APInt::udiv((APInt *)this,A);
    uVar2 = AVar3._8_8_;
  }
  else {
    if (RM != UP) {
      llvm_unreachable_internal
                ("Unknown APInt::Rounding enum",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                 ,0xa76);
    }
    Quo.BitWidth = 1;
    Quo.U.VAL = 0;
    Rem.U.VAL = 0;
    Rem.BitWidth = Quo.BitWidth;
    APInt::udivrem(A,B,&Quo,&Rem);
    bVar1 = APInt::operator==(&Rem,0);
    if (bVar1) {
      *(uint *)(this + 8) = Quo.BitWidth;
      *(anon_union_8_2_1313ab2f_for_U *)this = Quo.U;
      Quo.BitWidth = 0;
    }
    else {
      APInt::APInt(&local_20,&Quo);
      operator+((llvm *)this,&local_20,1);
      APInt::~APInt(&local_20);
    }
    APInt::~APInt(&Rem);
    APInt::~APInt(&Quo);
    uVar2 = extraout_RDX;
  }
  AVar3._8_8_ = uVar2;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt llvm::APIntOps::RoundingUDiv(const APInt &A, const APInt &B,
                                   APInt::Rounding RM) {
  // Currently udivrem always rounds down.
  switch (RM) {
  case APInt::Rounding::DOWN:
  case APInt::Rounding::TOWARD_ZERO:
    return A.udiv(B);
  case APInt::Rounding::UP: {
    APInt Quo, Rem;
    APInt::udivrem(A, B, Quo, Rem);
    if (Rem == 0)
      return Quo;
    return Quo + 1;
  }
  }
  llvm_unreachable("Unknown APInt::Rounding enum");
}